

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O3

void xmlCatalogSetDefaults(xmlCatalogAllow allow)

{
  if (allow < 4 && xmlDebugCatalogs != 0) {
    xmlCatalogPrintDebug(&DAT_001cd41c + *(int *)(&DAT_001cd41c + (ulong)allow * 4));
  }
  xmlCatalogDefaultAllow = allow;
  return;
}

Assistant:

void
xmlCatalogSetDefaults(xmlCatalogAllow allow) {
    if (xmlDebugCatalogs) {
	switch (allow) {
	    case XML_CATA_ALLOW_NONE:
		xmlCatalogPrintDebug(
			"Disabling catalog usage\n");
		break;
	    case XML_CATA_ALLOW_GLOBAL:
		xmlCatalogPrintDebug(
			"Allowing only global catalogs\n");
		break;
	    case XML_CATA_ALLOW_DOCUMENT:
		xmlCatalogPrintDebug(
			"Allowing only catalogs from the document\n");
		break;
	    case XML_CATA_ALLOW_ALL:
		xmlCatalogPrintDebug(
			"Allowing all catalogs\n");
		break;
	}
    }
    xmlCatalogDefaultAllow = allow;
}